

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

buffer_t ZSTDMT_getBuffer(ZSTDMT_bufferPool *bufPool)

{
  buffer_t bVar1;
  uint uVar2;
  void *local_70;
  void *start;
  size_t availBufferSize;
  size_t bSize;
  ZSTDMT_bufferPool *bufPool_local;
  buffer_t buf;
  
  local_70 = (void *)bufPool->bufferSize;
  pthread_mutex_lock((pthread_mutex_t *)bufPool);
  if (bufPool->nbBuffers != 0) {
    uVar2 = bufPool->nbBuffers - 1;
    bufPool->nbBuffers = uVar2;
    bufPool_local = (ZSTDMT_bufferPool *)bufPool->bTable[uVar2].start;
    buf.start = (void *)bufPool->bTable[uVar2].capacity;
    uVar2 = bufPool->nbBuffers;
    bufPool->bTable[uVar2].start = (void *)0x0;
    bufPool->bTable[uVar2].capacity = 0;
    if (local_70 <= buf.start && (void *)((ulong)buf.start >> 3) <= local_70) {
      pthread_mutex_unlock((pthread_mutex_t *)bufPool);
      goto LAB_00203171;
    }
    ZSTD_free(bufPool_local,bufPool->cMem);
  }
  pthread_mutex_unlock((pthread_mutex_t *)bufPool);
  bufPool_local = (ZSTDMT_bufferPool *)ZSTD_malloc((size_t)local_70,bufPool->cMem);
  if (bufPool_local == (ZSTDMT_bufferPool *)0x0) {
    local_70 = (void *)0x0;
  }
  buf.start = local_70;
LAB_00203171:
  bVar1.capacity = (size_t)buf.start;
  bVar1.start = bufPool_local;
  return bVar1;
}

Assistant:

static buffer_t ZSTDMT_getBuffer(ZSTDMT_bufferPool* bufPool)
{
    size_t const bSize = bufPool->bufferSize;
    DEBUGLOG(5, "ZSTDMT_getBuffer: bSize = %u", (U32)bufPool->bufferSize);
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    if (bufPool->nbBuffers) {   /* try to use an existing buffer */
        buffer_t const buf = bufPool->bTable[--(bufPool->nbBuffers)];
        size_t const availBufferSize = buf.capacity;
        bufPool->bTable[bufPool->nbBuffers] = g_nullBuffer;
        if ((availBufferSize >= bSize) & ((availBufferSize>>3) <= bSize)) {
            /* large enough, but not too much */
            DEBUGLOG(5, "ZSTDMT_getBuffer: provide buffer %u of size %u",
                        bufPool->nbBuffers, (U32)buf.capacity);
            ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
            return buf;
        }
        /* size conditions not respected : scratch this buffer, create new one */
        DEBUGLOG(5, "ZSTDMT_getBuffer: existing buffer does not meet size conditions => freeing");
        ZSTD_free(buf.start, bufPool->cMem);
    }
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
    /* create new buffer */
    DEBUGLOG(5, "ZSTDMT_getBuffer: create a new buffer");
    {   buffer_t buffer;
        void* const start = ZSTD_malloc(bSize, bufPool->cMem);
        buffer.start = start;   /* note : start can be NULL if malloc fails ! */
        buffer.capacity = (start==NULL) ? 0 : bSize;
        if (start==NULL) {
            DEBUGLOG(5, "ZSTDMT_getBuffer: buffer allocation failure !!");
        } else {
            DEBUGLOG(5, "ZSTDMT_getBuffer: created buffer of size %u", (U32)bSize);
        }
        return buffer;
    }
}